

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::LocalsWalker::GetGroupObject
          (LocalsWalker *this,UIGroupType uiGroupType,int i,ResolvedObject *pResolvedObject)

{
  BOOL BVar1;
  Type *ppVVar2;
  int iVar3;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int index;
  
  this_00 = this->pVarWalkers;
  if (this_00 !=
      (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar3 = 0;
    for (index = 0;
        index < (this_00->
                super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count; index = index + 1) {
      ppVVar2 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,index);
      if ((*ppVVar2)->groupType == uiGroupType) {
        iVar3 = iVar3 + 1;
        if (i < iVar3) {
          BVar1 = VariableWalkerBase::GetGroupObject(*ppVVar2,pResolvedObject);
          return BVar1;
        }
      }
      this_00 = this->pVarWalkers;
    }
  }
  return 0;
}

Assistant:

BOOL LocalsWalker::GetGroupObject(Js::UIGroupType uiGroupType, int i, ResolvedObject* pResolvedObject)
    {
        if (pVarWalkers)
        {
            int scopeCount = 0;
            for (int j = 0; j < pVarWalkers->Count(); j++)
            {
                VariableWalkerBase* variableWalker = pVarWalkers->Item(j);

                if (variableWalker->groupType == uiGroupType)
                {
                    scopeCount++;
                    if (i < scopeCount)
                    {
                        return variableWalker->GetGroupObject(pResolvedObject);
                    }
                }
            }
        }
        return FALSE;
    }